

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall
QTableModel::moveRows
          (QTableModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < sourceRow) {
    iVar4 = (**(code **)(*(long *)this + 0x78))();
    bVar2 = false;
    if ((destinationChild < 0) || (iVar4 < count + sourceRow)) goto LAB_00534c49;
    iVar4 = (**(code **)(*(long *)this + 0x78))(this,destinationParent);
    bVar2 = false;
    if ((sourceRow == destinationChild) || (bVar2 = false, iVar4 < destinationChild))
    goto LAB_00534c49;
    if (((0 < count && destinationChild + -1 != sourceRow) &&
        (bVar2 = QModelIndex::isValid(sourceParent), !bVar2)) &&
       (bVar2 = QModelIndex::isValid(destinationParent), !bVar2)) {
      cVar3 = QAbstractItemModel::beginMoveRows
                        ((QModelIndex *)this,(int)sourceParent,sourceRow,
                         (QModelIndex *)(ulong)((count + sourceRow) - 1),(int)destinationParent);
      bVar2 = false;
      if (cVar3 != '\0') {
        iVar5 = (**(code **)(*(long *)this + 0x80))(this);
        iVar5 = iVar5 * count;
        iVar6 = (int)(this->horizontalHeaderItems).d.size;
        iVar4 = iVar5 + -1;
        if ((uint)destinationChild >= (uint)sourceRow) {
          iVar4 = 0;
        }
        while (bVar2 = iVar5 != 0, iVar5 = iVar5 + -1, bVar2) {
          QList<QTableWidgetItem_*>::move
                    (&this->tableItems,(long)(iVar4 + iVar6 * sourceRow),
                     (long)(int)(iVar6 * destinationChild + -1 +
                                (uint)((uint)destinationChild < (uint)sourceRow)));
        }
        iVar6 = 0;
        iVar4 = destinationChild + -1;
        if ((uint)destinationChild < (uint)sourceRow) {
          iVar6 = count + -1;
          iVar4 = destinationChild;
        }
        while (bVar2 = count != 0, count = count + -1, bVar2) {
          QList<QTableWidgetItem_*>::move
                    (&this->verticalHeaderItems,(ulong)(uint)(iVar6 + sourceRow),(long)iVar4);
        }
        QAbstractItemModel::endMoveRows();
        bVar2 = true;
      }
      goto LAB_00534c49;
    }
  }
  bVar2 = false;
LAB_00534c49:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QTableModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceRow < 0
        || sourceRow + count - 1 >= rowCount(sourceParent)
        || destinationChild < 0
        || destinationChild > rowCount(destinationParent)
        || sourceRow == destinationChild
        || sourceRow == destinationChild - 1
        || count <= 0
        || sourceParent.isValid()
        || destinationParent.isValid()) {
        return false;
    }
    if (!beginMoveRows(sourceParent, sourceRow, sourceRow + count - 1, destinationParent, destinationChild))
        return false;

    // Table items
    int numItems = count * columnCount();
    int fromIndex = tableIndex(sourceRow, 0);
    int destinationIndex = tableIndex(destinationChild, 0);
    if (destinationChild < sourceRow)
        fromIndex += numItems - 1;
    else
        destinationIndex--;
    while (numItems--)
        tableItems.move(fromIndex, destinationIndex);

    // Header items
    int fromRow = sourceRow;
    if (destinationChild < sourceRow)
        fromRow += count - 1;
    else
        destinationChild--;
    while (count--)
        verticalHeaderItems.move(fromRow, destinationChild);

    endMoveRows();
    return true;
}